

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishVector
               (HelicsPublication pub,double *vectorInput,int vectorLength,HelicsError *err)

{
  PublicationObject *pPVar1;
  int in_EDX;
  long in_RSI;
  PublicationObject *pubObj;
  undefined4 in_stack_00000050;
  int in_stack_00000084;
  double *in_stack_00000088;
  Publication *in_stack_00000090;
  HelicsError *in_stack_ffffffffffffffa0;
  HelicsPublication in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (pPVar1 != (PublicationObject *)0x0) {
    if ((in_RSI == 0) || (in_EDX < 1)) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x1ce934);
      helics::Publication::publish
                ((Publication *)CONCAT44(vectorLength,in_stack_00000050),
                 (vector<double,_std::allocator<double>_> *)err);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffb0);
    }
    else {
      helics::Publication::publish(in_stack_00000090,in_stack_00000088,in_stack_00000084);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishVector(HelicsPublication pub, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            pubObj->pubPtr->publish(std::vector<double>());
        } else {
            pubObj->pubPtr->publish(vectorInput, vectorLength);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}